

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

string * __thiscall
AmpIO::ReadRobotSerialNumber_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  allocator<char> local_6e;
  undefined1 local_6d;
  undefined1 local_6c [4];
  uint local_68;
  uint32_t q;
  uint32_t flash_command;
  uint32_t flash_en;
  size_t i;
  uint16_t **ppuStack_50;
  uint32_t base_flash_addr;
  uint16_t *buf16;
  char buf [33];
  size_t read_length;
  AmpIO *this_local;
  string *serial_number;
  
  stack0xffffffffffffffe0 = 0x10;
  memset(&buf16,0,0x21);
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x64524131) {
    ppuStack_50 = &buf16;
    i._4_4_ = 0;
    for (_flash_command = 0; _flash_command < 0x10; _flash_command = _flash_command + 1) {
      for (q = 0; q < 2; q = q + 1) {
        local_68 = q << 0x1c | 0x1000000 | i._4_4_ + (int)_flash_command;
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        (*pBVar1->_vptr_BasePort[0x24])
                  (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa002,(ulong)local_68);
        Amp1394_Sleep(0.01);
      }
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      (*pBVar1->_vptr_BasePort[0x23])
                (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa031,local_6c);
      *(short *)((long)ppuStack_50 + _flash_command * 2) = local_6c._0_2_;
    }
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x24])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa002,0);
  }
  local_6d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&buf16,&local_6e);
  std::allocator<char>::~allocator(&local_6e);
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::ReadRobotSerialNumber() const
{
    // Experimental: implementation will likely change
    const size_t read_length = 16; // 16 words, 32 bytes.
    char buf[read_length * 2 + 1] = {'\0'};
    if (GetHardwareVersion() == dRA1_String) {
        uint16_t* buf16 = reinterpret_cast<uint16_t*>(buf);
        uint32_t base_flash_addr = 0;
        for (size_t i = 0; i < read_length; i++) {
            for (uint32_t flash_en = 0; flash_en < 2; flash_en++) {
                uint32_t flash_command = (flash_en << 28) | (1 << 24) | (base_flash_addr + i) ;
                port->WriteQuadlet(BoardId, 0xa002, flash_command);
                Amp1394_Sleep(0.01);
            }
            uint32_t q;
            port->ReadQuadlet(BoardId, 0xa031, q);
            buf16[i] = q & 0xFFFF;
        }
        port->WriteQuadlet(BoardId, 0xa002, 0);
    }
    std::string serial_number(buf);
    return serial_number;
}